

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall
sptk::Matrix::Matrix
          (Matrix *this,int num_row,int num_column,vector<double,_std::allocator<double>_> *vector)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  allocator_type local_19;
  
  this->_vptr_Matrix = (_func_int **)&PTR__Matrix_00112d28;
  if (num_row < 1) {
    num_row = 0;
  }
  this->num_row_ = num_row;
  iVar2 = 0;
  if (0 < num_column) {
    iVar2 = num_column;
  }
  this->num_column_ = iVar2;
  std::vector<double,_std::allocator<double>_>::vector(&this->data_,vector);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&this->index_,(long)this->num_row_,&local_19);
  iVar2 = this->num_row_;
  if (0 < (long)iVar2) {
    iVar1 = this->num_column_;
    lVar3 = 0;
    lVar4 = 0;
    do {
      (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] =
           (double *)
           ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar3);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + (long)iVar1 * 8;
    } while (iVar2 != lVar4);
  }
  return;
}

Assistant:

Matrix::Matrix(int num_row, int num_column, const std::vector<double>& vector)
    : num_row_(num_row < 0 ? 0 : num_row),
      num_column_(num_column < 0 ? 0 : num_column),
      data_(vector),
      index_(num_row_) {
  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}